

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * namePop(xmlParserCtxtPtr ctxt)

{
  xmlChar *ret;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->nameNr < 1)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt->nameNr = ctxt->nameNr + -1;
    if (ctxt->nameNr < 1) {
      ctxt->name = (xmlChar *)0x0;
    }
    else {
      ctxt->name = ctxt->nameTab[ctxt->nameNr + -1];
    }
    ctxt_local = (xmlParserCtxtPtr)ctxt->nameTab[ctxt->nameNr];
    ctxt->nameTab[ctxt->nameNr] = (xmlChar *)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

const xmlChar *
namePop(xmlParserCtxtPtr ctxt)
{
    const xmlChar *ret;

    if ((ctxt == NULL) || (ctxt->nameNr <= 0))
        return (NULL);
    ctxt->nameNr--;
    if (ctxt->nameNr > 0)
        ctxt->name = ctxt->nameTab[ctxt->nameNr - 1];
    else
        ctxt->name = NULL;
    ret = ctxt->nameTab[ctxt->nameNr];
    ctxt->nameTab[ctxt->nameNr] = NULL;
    return (ret);
}